

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_updateStats(optState_t *optPtr,U32 litLength,BYTE *literals,U32 offBase,U32 matchLength)

{
  int iVar1;
  U32 UVar2;
  uint uVar3;
  long in_RDX;
  uint in_ESI;
  optState_t *in_RDI;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 llCode;
  U32 u;
  uint local_24;
  
  iVar1 = ZSTD_compressedLiterals(in_RDI);
  if (iVar1 != 0) {
    for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
      in_RDI->litFreq[*(byte *)(in_RDX + (ulong)local_24)] =
           in_RDI->litFreq[*(byte *)(in_RDX + (ulong)local_24)] + 2;
    }
    in_RDI->litSum = in_ESI * 2 + in_RDI->litSum;
  }
  UVar2 = ZSTD_LLcode(0);
  in_RDI->litLengthFreq[UVar2] = in_RDI->litLengthFreq[UVar2] + 1;
  in_RDI->litLengthSum = in_RDI->litLengthSum + 1;
  uVar3 = ZSTD_highbit32(0);
  if (uVar3 < 0x20) {
    in_RDI->offCodeFreq[uVar3] = in_RDI->offCodeFreq[uVar3] + 1;
    in_RDI->offCodeSum = in_RDI->offCodeSum + 1;
    UVar2 = ZSTD_MLcode(0);
    in_RDI->matchLengthFreq[UVar2] = in_RDI->matchLengthFreq[UVar2] + 1;
    in_RDI->matchLengthSum = in_RDI->matchLengthSum + 1;
    return;
  }
  __assert_fail("offCode <= MaxOff",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x8098,"void ZSTD_updateStats(optState_t *const, U32, const BYTE *, U32, U32)");
}

Assistant:

static void ZSTD_updateStats(optState_t* const optPtr,
                             U32 litLength, const BYTE* literals,
                             U32 offBase, U32 matchLength)
{
    /* literals */
    if (ZSTD_compressedLiterals(optPtr)) {
        U32 u;
        for (u=0; u < litLength; u++)
            optPtr->litFreq[literals[u]] += ZSTD_LITFREQ_ADD;
        optPtr->litSum += litLength*ZSTD_LITFREQ_ADD;
    }

    /* literal Length */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        optPtr->litLengthFreq[llCode]++;
        optPtr->litLengthSum++;
    }

    /* offset code : follows storeSeq() numeric representation */
    {   U32 const offCode = ZSTD_highbit32(offBase);
        assert(offCode <= MaxOff);
        optPtr->offCodeFreq[offCode]++;
        optPtr->offCodeSum++;
    }

    /* match Length */
    {   U32 const mlBase = matchLength - MINMATCH;
        U32 const mlCode = ZSTD_MLcode(mlBase);
        optPtr->matchLengthFreq[mlCode]++;
        optPtr->matchLengthSum++;
    }
}